

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_GetGlyphKernAdvance(stbtt_fontinfo *info,int glyph1,int glyph2)

{
  uchar *puVar1;
  stbtt_uint32 sVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  lVar5 = (long)info->kern;
  if (((lVar5 != 0) && (puVar1 = info->data, puVar1[lVar5 + 3] != '\0' || puVar1[lVar5 + 2] != '\0')
      ) && ((ushort)(*(ushort *)(puVar1 + lVar5 + 8) << 8 | *(ushort *)(puVar1 + lVar5 + 8) >> 8) ==
            1)) {
    iVar8 = (ushort)(*(ushort *)(puVar1 + lVar5 + 10) << 8 | *(ushort *)(puVar1 + lVar5 + 10) >> 8)
            - 1;
    uVar4 = glyph1 << 0x10 | glyph2;
    iVar7 = 0;
    while (iVar7 <= iVar8) {
      iVar6 = iVar8 + iVar7 >> 1;
      lVar3 = (long)iVar6 * 6;
      sVar2 = ttULONG(puVar1 + lVar3 + lVar5 + 0x12);
      if (uVar4 < sVar2) {
        iVar8 = iVar6 + -1;
      }
      else {
        if (uVar4 <= sVar2) {
          return (int)(short)((ushort)puVar1[lVar3 + lVar5 + 0x16] << 8) |
                 (uint)puVar1[lVar3 + lVar5 + 0x17];
        }
        iVar7 = iVar6 + 1;
      }
    }
  }
  return 0;
}

Assistant:

STBTT_DEF int  stbtt_GetGlyphKernAdvance(const stbtt_fontinfo *info, int glyph1, int glyph2)
{
   stbtt_uint8 *data = info->data + info->kern;
   stbtt_uint32 needle, straw;
   int l, r, m;

   // we only look at the first table. it must be 'horizontal' and format 0.
   if (!info->kern)
      return 0;
   if (ttUSHORT(data+2) < 1) // number of tables, need at least 1
      return 0;
   if (ttUSHORT(data+8) != 1) // horizontal flag must be set in format
      return 0;

   l = 0;
   r = ttUSHORT(data+10) - 1;
   needle = glyph1 << 16 | glyph2;
   while (l <= r) {
      m = (l + r) >> 1;
      straw = ttULONG(data+18+(m*6)); // note: unaligned read
      if (needle < straw)
         r = m - 1;
      else if (needle > straw)
         l = m + 1;
      else
         return ttSHORT(data+22+(m*6));
   }
   return 0;
}